

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O3

NULLCRef *
NULLCTypeInfo::MemberByName(NULLCRef *__return_storage_ptr__,NULLCRef obj,NULLCArray member)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  uint *puVar4;
  uint uVar5;
  char *pcVar6;
  
  if (linker == 0) {
    __assert_fail("linker",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                  ,0x5a,"NULLCRef NULLCTypeInfo::MemberByName(NULLCRef, NULLCArray)");
  }
  if (*(uint *)(linker + 0x20c) <= obj.typeID) {
    pcVar6 = 
    "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
    ;
LAB_00121dde:
    __assert_fail("index < count",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/../Array.h"
                  ,0x7f,pcVar6);
  }
  if (*(int *)(*(long *)(linker + 0x200) + 0x10 + (ulong)obj.typeID * 0x50) == 4) {
    puVar4 = (uint *)(*(long *)(linker + 0x200) + (ulong)obj.typeID * 0x50);
    uVar5 = *puVar4;
    if (*(uint *)(linker + 0x29c) <= uVar5) {
      pcVar6 = 
      "T &FastVector<char>::operator[](unsigned int) [T = char, zeroNewMemory = false, skipConstructor = false]"
      ;
      goto LAB_00121dde;
    }
    uVar1 = puVar4[6];
    if (uVar1 != 0) {
      pcVar6 = (char *)((ulong)uVar5 + *(long *)(linker + 0x290));
      sVar3 = strlen(pcVar6);
      pcVar6 = pcVar6 + sVar3;
      uVar5 = 0;
      do {
        pcVar6 = pcVar6 + 1;
        iVar2 = strcmp(pcVar6,member.ptr);
        if (iVar2 == 0) {
          MemberByIndex(__return_storage_ptr__,obj,uVar5);
          return __return_storage_ptr__;
        }
        sVar3 = strlen(pcVar6);
        pcVar6 = pcVar6 + sVar3;
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
    }
  }
  *(undefined4 *)((long)&__return_storage_ptr__->ptr + 4) = 0;
  *(undefined8 *)__return_storage_ptr__ = 0;
  return __return_storage_ptr__;
}

Assistant:

NULLCRef MemberByName(NULLCRef obj, NULLCArray member)
	{
		assert(linker);
		ExternTypeInfo &exType = linker->exTypes[obj.typeID];
		if(exType.subCat != ExternTypeInfo::CAT_CLASS)
			return NULLCRef();
		const char *str = &linker->exSymbols[exType.offsetToName];
		const char *memberName = str + strlen(str) + 1;
		for(unsigned i = 0; i < exType.memberCount; i++)
		{
			if(strcmp(memberName, member.ptr) == 0)
				return MemberByIndex(obj, i);
			memberName += strlen(memberName) + 1;
		}
		return NULLCRef();
	}